

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlyphBoundaries.cpp
# Opt level: O0

void __thiscall
GlyphBoundaries::UnnormalizeSumAndDiff
          (GlyphBoundaries *this,float dSum,float dDiff,int *pmSum,int *pmDiff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int mDiffScale;
  int mSumScale;
  int mMaxDiff;
  int mMinDiff;
  int mMaxSum;
  int mMinSum;
  int *pmDiff_local;
  int *pmSum_local;
  float dDiff_local;
  float dSum_local;
  GlyphBoundaries *this_local;
  
  iVar3 = this->m_mxBbMin + this->m_myBbMin;
  iVar4 = this->m_mxBbMin - this->m_myBbMax;
  iVar1 = this->m_mxBbMax;
  iVar2 = this->m_myBbMin;
  *pmSum = (int)(dSum * (float)((this->m_mxBbMax + this->m_myBbMax) - iVar3)) + iVar3;
  *pmDiff = (int)(dDiff * (float)((iVar1 - iVar2) - iVar4)) + iVar4;
  return;
}

Assistant:

void GlyphBoundaries::UnnormalizeSumAndDiff(float dSum, float dDiff, int * pmSum, int * pmDiff)
{
	int mMinSum = m_mxBbMin + m_myBbMin;	// lower-left point
	int mMaxSum = m_mxBbMax + m_myBbMax;	// upper-right point
	int mMinDiff = m_mxBbMin - m_myBbMax;	// upper-left point
	int mMaxDiff = m_mxBbMax - m_myBbMin;	// lower-right point

	int mSumScale = mMaxSum - mMinSum;
	int mDiffScale = mMaxDiff - mMinDiff;
	Assert(mSumScale == mDiffScale);

	*pmSum = (int)(dSum * mSumScale) + mMinSum;
	*pmDiff = (int)(dDiff * mDiffScale) + mMinDiff;
}